

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gethostname.c
# Opt level: O1

int run_test_gethostname(void)

{
  size_t sVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  size_t sVar3;
  sockaddr_in *in_RCX;
  long extraout_RDX;
  int iVar4;
  uv_loop_t *puVar5;
  size_t size;
  size_t enobufs_size;
  char buf [65];
  size_t local_68;
  size_t local_60;
  char local_58 [80];
  
  local_68 = 1;
  iVar2 = uv_os_gethostname((char *)0x0,&local_68);
  if (iVar2 == -0x16) {
    iVar2 = uv_os_gethostname(local_58,(size_t *)0x0);
    if (iVar2 != -0x16) goto LAB_001592df;
    local_68 = 0;
    iVar2 = uv_os_gethostname(local_58,&local_68);
    if (iVar2 != -0x16) goto LAB_001592e4;
    local_60 = 1;
    local_58[0] = '\0';
    iVar2 = uv_os_gethostname(local_58,&local_60);
    if (iVar2 != -0x69) goto LAB_001592e9;
    if (local_58[0] != '\0') goto LAB_001592ee;
    if (local_60 < 2) goto LAB_001592f3;
    local_68 = 0x41;
    iVar2 = uv_os_gethostname(local_58,&local_68);
    sVar1 = local_68;
    if (iVar2 != 0) goto LAB_001592f8;
    if (local_68 < 2) {
LAB_001592d5:
      run_test_gethostname_cold_8();
      goto LAB_001592da;
    }
    sVar3 = strlen(local_58);
    if (sVar1 != sVar3) goto LAB_001592d5;
    if (sVar1 + 1 == local_60) {
      return 0;
    }
  }
  else {
LAB_001592da:
    run_test_gethostname_cold_1();
LAB_001592df:
    run_test_gethostname_cold_2();
LAB_001592e4:
    run_test_gethostname_cold_3();
LAB_001592e9:
    run_test_gethostname_cold_4();
LAB_001592ee:
    run_test_gethostname_cold_5();
LAB_001592f3:
    run_test_gethostname_cold_6();
LAB_001592f8:
    run_test_gethostname_cold_7();
  }
  run_test_gethostname_cold_9();
  puVar5 = (uv_loop_t *)0x1a4b5a;
  iVar4 = 0x50;
  iVar2 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  if (iVar2 == 0) {
    puVar5 = uv_default_loop();
    iVar4 = 0x2fdcb0;
    in_RCX = &addr4;
    iVar2 = uv_getnameinfo(puVar5,&req,getnameinfo_req,(sockaddr *)&addr4,0);
    if (iVar2 != 0) goto LAB_00159396;
    puVar5 = uv_default_loop();
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    iVar4 = 0;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_getnameinfo_basic_ip4_cold_1();
LAB_00159396:
    run_test_getnameinfo_basic_ip4_cold_2();
  }
  run_test_getnameinfo_basic_ip4_cold_3();
  if (puVar5 == (uv_loop_t *)0x0) {
    getnameinfo_req_cold_4();
LAB_001593bb:
    getnameinfo_req_cold_1();
LAB_001593c0:
    getnameinfo_req_cold_3();
  }
  else {
    if (iVar4 != 0) goto LAB_001593bb;
    if (extraout_RDX == 0) goto LAB_001593c0;
    if (in_RCX != (sockaddr_in *)0x0) {
      return extraout_EAX;
    }
  }
  getnameinfo_req_cold_2();
  iVar2 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  if (iVar2 == 0) {
    puVar5 = uv_default_loop();
    iVar2 = uv_getnameinfo(puVar5,&req,(uv_getnameinfo_cb)0x0,(sockaddr *)&addr4,0);
    if (iVar2 != 0) goto LAB_0015945a;
    if (req.host[0] == '\0') goto LAB_0015945f;
    if (req.service[0] == '\0') goto LAB_00159464;
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_getnameinfo_basic_ip4_sync_cold_1();
LAB_0015945a:
    run_test_getnameinfo_basic_ip4_sync_cold_2();
LAB_0015945f:
    run_test_getnameinfo_basic_ip4_sync_cold_5();
LAB_00159464:
    run_test_getnameinfo_basic_ip4_sync_cold_4();
  }
  run_test_getnameinfo_basic_ip4_sync_cold_3();
  puVar5 = (uv_loop_t *)0x199c09;
  iVar2 = uv_ip6_addr("::1",0x50,&addr6);
  if (iVar2 == 0) {
    puVar5 = uv_default_loop();
    iVar2 = uv_getnameinfo(puVar5,&req,getnameinfo_req,(sockaddr *)&addr6,0);
    if (iVar2 == 0) {
      puVar5 = uv_default_loop();
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar2 = uv_loop_close(puVar5);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00159505;
    }
  }
  else {
    run_test_getnameinfo_basic_ip6_cold_1();
  }
  run_test_getnameinfo_basic_ip6_cold_2();
LAB_00159505:
  run_test_getnameinfo_basic_ip6_cold_3();
  iVar2 = uv_is_closing((uv_handle_t *)puVar5);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(gethostname) {
  char buf[UV_MAXHOSTNAMESIZE];
  size_t size;
  size_t enobufs_size;
  int r;

  /* Reject invalid inputs */
  size = 1;
  r = uv_os_gethostname(NULL, &size);
  ASSERT(r == UV_EINVAL);
  r = uv_os_gethostname(buf, NULL);
  ASSERT(r == UV_EINVAL);
  size = 0;
  r = uv_os_gethostname(buf, &size);
  ASSERT(r == UV_EINVAL);

  /* Return UV_ENOBUFS if the buffer cannot hold the hostname */
  enobufs_size = 1;
  buf[0] = '\0';
  r = uv_os_gethostname(buf, &enobufs_size);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(buf[0] == '\0');
  ASSERT(enobufs_size > 1);

  /* Successfully get the hostname */
  size = UV_MAXHOSTNAMESIZE;
  r = uv_os_gethostname(buf, &size);
  ASSERT(r == 0);
  ASSERT(size > 1 && size == strlen(buf));
  ASSERT(size + 1 == enobufs_size);

  return 0;
}